

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cpp
# Opt level: O3

FileName * __thiscall embree::FileName::dropExt(FileName *__return_storage_ptr__,FileName *this)

{
  long lVar1;
  string local_38;
  
  lVar1 = std::__cxx11::string::rfind((char)this,0x2e);
  if (lVar1 == -1) {
    FileName(__return_storage_ptr__,&this->filename);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_38,(ulong)this);
    FileName(__return_storage_ptr__,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

FileName FileName::dropExt() const {
    size_t pos = filename.find_last_of('.');
    if (pos == std::string::npos) return filename;
    return filename.substr(0,pos);
  }